

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O1

int __thiscall zmq::socket_poller_t::remove_fd(socket_poller_t *this,fd_t fd_)

{
  pointer __src;
  pointer *ppiVar1;
  pointer piVar2;
  int iVar3;
  int *piVar4;
  pointer __dest;
  
  piVar2 = (this->_items).
           super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__dest = (this->_items).
                super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (__dest != piVar2 && ((__dest->socket != (socket_base_t *)0x0 || (__dest->fd != fd_))));
      __dest = __dest + 1) {
  }
  if (__dest == piVar2) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar3 = -1;
  }
  else {
    __src = __dest + 1;
    if (__src != piVar2) {
      memmove(__dest,__src,(long)piVar2 - (long)__src);
    }
    ppiVar1 = &(this->_items).
               super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
    this->_need_rebuild = true;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int zmq::socket_poller_t::remove_fd (fd_t fd_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    _items.erase (it);
    _need_rebuild = true;

    return 0;
}